

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall Memory::Recycler::CheckLeaksOnProcessDetach(Recycler *this,char16 *header)

{
  anon_class_16_2_400fb288 fn;
  ConfigFlagsTable *pCVar1;
  char16 *header_local;
  Recycler *this_local;
  
  pCVar1 = GetRecyclerFlagsTable(this);
  if ((pCVar1->CheckMemoryLeak & 1U) != 0) {
    fn.header = header;
    fn.this = this;
    ReportOnProcessDetach<Memory::Recycler::CheckLeaksOnProcessDetach(char16_t_const*)::__0>
              (this,fn);
  }
  return;
}

Assistant:

void
Recycler::CheckLeaksOnProcessDetach(char16 const * header)
{
    if (GetRecyclerFlagsTable().CheckMemoryLeak)
    {
        ReportOnProcessDetach([=]() { this->CheckLeaks(header); });
    }
}